

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O0

void alsa_deallocate_voice(ALLEGRO_VOICE *voice)

{
  long lVar1;
  long in_RDI;
  ALSA_VOICE *alsa_voice;
  
  lVar1 = *(long *)(in_RDI + 0x50);
  al_lock_mutex(*(undefined8 *)(in_RDI + 0x30));
  al_set_thread_should_stop(*(undefined8 *)(lVar1 + 0x28));
  al_broadcast_cond(*(undefined8 *)(in_RDI + 0x38));
  al_unlock_mutex(*(undefined8 *)(in_RDI + 0x30));
  al_join_thread(*(undefined8 *)(lVar1 + 0x28),0);
  snd_pcm_drop(*(undefined8 *)(lVar1 + 0x30));
  snd_pcm_close(*(undefined8 *)(lVar1 + 0x30));
  al_destroy_thread(*(undefined8 *)(lVar1 + 0x28));
  al_free_with_context
            (*(undefined8 *)(lVar1 + 0x18),0x2ce,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
             ,"alsa_deallocate_voice");
  al_free_with_context
            (*(undefined8 *)(in_RDI + 0x50),0x2cf,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
             ,"alsa_deallocate_voice");
  *(undefined8 *)(in_RDI + 0x50) = 0;
  return;
}

Assistant:

static void alsa_deallocate_voice(ALLEGRO_VOICE *voice)
{
   ALSA_VOICE *alsa_voice = (ALSA_VOICE*)voice->extra;

   al_lock_mutex(voice->mutex);
   al_set_thread_should_stop(alsa_voice->poll_thread);
   al_broadcast_cond(voice->cond);
   al_unlock_mutex(voice->mutex);
   al_join_thread(alsa_voice->poll_thread, NULL);

   snd_pcm_drop(alsa_voice->pcm_handle);
   snd_pcm_close(alsa_voice->pcm_handle);

   al_destroy_thread(alsa_voice->poll_thread);
   al_free(alsa_voice->ufds);
   al_free(voice->extra);
   voice->extra = NULL;
}